

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Clara::CommandLine<Catch::ConfigData>::Arg::validate(Arg *this)

{
  int iVar1;
  logic_error *this_00;
  long *plVar2;
  long *plVar3;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  iVar1 = (*((this->boundField).functionObj)->_vptr_IArgFunction[4])();
  if (((char)iVar1 != '\0') && ((this->hint)._M_string_length == 0)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    dbgName_abi_cxx11_(&local_40,this);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_60 = (long *)*plVar2;
    plVar3 = plVar2 + 2;
    if (local_60 == plVar3) {
      local_50 = *plVar3;
      lStack_48 = plVar2[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar3;
    }
    local_58 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_60);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void validate() const {
                if( boundField.takesArg() && !takesArg() )
                    throw std::logic_error( dbgName() + " must specify an arg name" );
            }